

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O0

void __thiscall ir_tree_visitor::visit(ir_tree_visitor *this,IfStatement *ptr)

{
  SubtreeWrapper *pSVar1;
  SubtreeWrapper *pSVar2;
  int iVar3;
  LabelStatement *pLVar4;
  LabelStatement *this_00;
  SeqStatement *pSVar5;
  undefined4 extraout_var;
  StatementWrapper *this_01;
  undefined4 extraout_var_00;
  Label local_118;
  Label local_f8;
  undefined1 local_d2;
  undefined1 local_d1;
  Label local_d0;
  Label *local_b0;
  Label *result_true;
  Label local_a0;
  LabelStatement *local_80;
  Statement *suffix;
  undefined1 local_68 [8];
  Label label_join;
  Label label_true;
  SubtreeWrapper *true_branch;
  SubtreeWrapper *condition;
  IfStatement *ptr_local;
  ir_tree_visitor *this_local;
  
  (**(ptr->condition->super_Base)._vptr_Base)();
  pSVar1 = this->curr_wrapper;
  (**(ptr->do_if_true->super_Base)._vptr_Base)();
  pSVar2 = this->curr_wrapper;
  IRT::Label::Label((Label *)((long)&label_join.label_.field_2 + 8));
  IRT::Label::Label((Label *)local_68);
  pLVar4 = (LabelStatement *)operator_new(0x28);
  result_true._7_1_ = 1;
  IRT::Label::Label(&local_a0,(Label *)local_68);
  IRT::LabelStatement::LabelStatement(pLVar4,&local_a0);
  result_true._7_1_ = 0;
  IRT::Label::~Label(&local_a0);
  local_b0 = (Label *)local_68;
  local_80 = pLVar4;
  if (pSVar2 != (SubtreeWrapper *)0x0) {
    local_b0 = (Label *)((long)&label_join.label_.field_2 + 8);
    pLVar4 = (LabelStatement *)operator_new(0x18);
    local_d2 = 1;
    this_00 = (LabelStatement *)operator_new(0x28);
    local_d1 = 1;
    IRT::Label::Label(&local_d0,(Label *)((long)&label_join.label_.field_2 + 8));
    IRT::LabelStatement::LabelStatement(this_00,&local_d0);
    local_d1 = 0;
    pSVar5 = (SeqStatement *)operator_new(0x18);
    iVar3 = (*pSVar2->_vptr_SubtreeWrapper[3])();
    IRT::SeqStatement::SeqStatement
              (pSVar5,(Statement *)CONCAT44(extraout_var,iVar3),&local_80->super_Statement);
    IRT::SeqStatement::SeqStatement((SeqStatement *)pLVar4,(Statement *)this_00,(Statement *)pSVar5)
    ;
    local_d2 = 0;
    local_80 = pLVar4;
    IRT::Label::~Label(&local_d0);
  }
  this_01 = (StatementWrapper *)operator_new(0x10);
  pSVar5 = (SeqStatement *)operator_new(0x18);
  IRT::Label::Label(&local_f8,local_b0);
  IRT::Label::Label(&local_118,(Label *)local_68);
  iVar3 = (*pSVar1->_vptr_SubtreeWrapper[4])(pSVar1,&local_f8,&local_118);
  IRT::SeqStatement::SeqStatement
            (pSVar5,(Statement *)CONCAT44(extraout_var_00,iVar3),&local_80->super_Statement);
  IRT::StatementWrapper::StatementWrapper(this_01,(Statement *)pSVar5);
  this->curr_wrapper = (SubtreeWrapper *)this_01;
  IRT::Label::~Label(&local_118);
  IRT::Label::~Label(&local_f8);
  IRT::Label::~Label((Label *)local_68);
  IRT::Label::~Label((Label *)((long)&label_join.label_.field_2 + 8));
  return;
}

Assistant:

void ir_tree_visitor::visit(IfStatement* ptr) {
    ptr->condition->accept(this);
    auto condition = curr_wrapper;
    ptr->do_if_true->accept(this);
    auto true_branch = curr_wrapper;

    IRT::Label label_true;
    IRT::Label label_join;
    IRT::Statement* suffix = new IRT::LabelStatement(label_join);

    IRT::Label* result_true = &label_join;

    if (true_branch) {
        result_true = &label_true;
        suffix = new IRT::SeqStatement(
            new IRT::LabelStatement(label_true),
            new IRT::SeqStatement(true_branch->ToStatement(), suffix)
        );
    }

    curr_wrapper = new IRT::StatementWrapper(
            new IRT::SeqStatement(
                condition->ToConditional(*result_true, label_join),
                suffix
            )
    );
}